

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.hpp
# Opt level: O2

void __thiscall Diligent::DeviceContextVkImpl::EnsureVkCmdBuffer(DeviceContextVkImpl *this)

{
  Uint32 UVar1;
  VulkanCommandBufferPool *pVVar2;
  VkAccessFlags VVar3;
  VkCommandBuffer pVVar4;
  char (*in_RCX) [21];
  string msg;
  string local_30;
  
  if (this->m_CmdPool == (VulkanCommandBufferPool *)0x0) {
    FormatString<char[26],char[21]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_CmdPool != nullptr",in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"EnsureVkCmdBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
               ,0x1c4);
    std::__cxx11::string::~string((string *)&local_30);
  }
  UVar1 = (this->m_State).NumCommands;
  (this->m_State).NumCommands = UVar1 + (UVar1 == 0);
  if ((this->m_CommandBuffer).m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    pVVar4 = VulkanUtilities::VulkanCommandBufferPool::GetCommandBuffer(this->m_CmdPool,"");
    pVVar2 = this->m_CmdPool;
    (this->m_CommandBuffer).m_VkCmdBuffer = pVVar4;
    VVar3 = pVVar2->m_SupportedAccessMask;
    (this->m_CommandBuffer).m_Barrier.SupportedStagesMask = pVVar2->m_SupportedStagesMask;
    (this->m_CommandBuffer).m_Barrier.SupportedAccessMask = VVar3;
  }
  return;
}

Assistant:

__forceinline void EnsureVkCmdBuffer()
    {
        VERIFY_EXPR(m_CmdPool != nullptr);

        // Make sure that the number of commands in the context is at least one,
        // so that the context cannot be disposed by Flush()
        m_State.NumCommands = m_State.NumCommands != 0 ? m_State.NumCommands : 1;
        if (m_CommandBuffer.GetVkCmdBuffer() == VK_NULL_HANDLE)
        {
            VkCommandBuffer vkCmdBuff = m_CmdPool->GetCommandBuffer();
            m_CommandBuffer.SetVkCmdBuffer(vkCmdBuff, m_CmdPool->GetSupportedStagesMask(), m_CmdPool->GetSupportedAccessMask());
        }
    }